

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_format.c
# Opt level: O1

size_t cvt_s(int code,void *value,zt_fmt_put_f put,void *cl,uchar *flags,ssize_t width,
            ssize_t precision)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  char *__s;
  
  __s = *value;
  if ((width != -0x80000000) && (flags[0x23] != '\0')) {
    lVar4 = -width;
    if (0 < width) {
      lVar4 = width;
    }
    sVar1 = strlen(__s);
    lVar3 = 0;
    if (lVar4 < (int)sVar1) {
      lVar3 = lVar4;
    }
    __s = __s + lVar3;
    width = -0x80000000;
  }
  sVar1 = strlen(__s);
  sVar2 = zt_fmt_puts(__s,sVar1,put,cl,flags,width,precision);
  return sVar2;
}

Assistant:

static size_t
cvt_s(int code UNUSED, void * value,
      zt_fmt_put_f put, void * cl,
      unsigned char flags[],
      ssize_t width, ssize_t precision)
{
    size_t lstr;
    char * str = *(char **) value;

    zt_assert(str != NULL);

    if (flags['#']) {
        if (width != INT_MIN) {
            ssize_t   i = width;
            if (i < 0) {
                i = -i;
            }

            lstr = strlen(str);
            zt_assert(lstr < INT_MAX);
            if (i < (int)lstr) {
                str = str + i;
            }
            width = INT_MIN;
        }
    }

    return zt_fmt_puts(str, strlen(str), put, cl, flags, width, precision);
}